

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void Service_RegisterNodes
               (UA_Server *server,UA_Session *session,UA_RegisterNodesRequest *request,
               UA_RegisterNodesResponse *response)

{
  UA_StatusCode UVar1;
  undefined1 local_30 [8];
  timeval tv;
  
  gettimeofday((timeval *)local_30,(__timezone_ptr_t)0x0);
  (response->responseHeader).timestamp =
       (long)local_30 * 10000000 + tv.tv_sec * 10 + 0x19db1ded53e8000;
  if (request->nodesToRegisterSize == 0) {
    (response->responseHeader).serviceResult = 0x800f0000;
  }
  else {
    UVar1 = UA_Array_copy(request->nodesToRegister,request->nodesToRegisterSize,
                          &response->registeredNodeIds,UA_TYPES + 0x10);
    (response->responseHeader).serviceResult = UVar1;
    if (UVar1 == 0) {
      response->registeredNodeIdsSize = request->nodesToRegisterSize;
    }
  }
  return;
}

Assistant:

void Service_RegisterNodes(UA_Server *server, UA_Session *session, const UA_RegisterNodesRequest *request,
                           UA_RegisterNodesResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing RegisterNodesRequest");
    //TODO: hang the nodeids to the session if really needed
    response->responseHeader.timestamp = UA_DateTime_now();
    if(request->nodesToRegisterSize <= 0)
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
    else {
        response->responseHeader.serviceResult =
            UA_Array_copy(request->nodesToRegister, request->nodesToRegisterSize,
                          (void**)&response->registeredNodeIds, &UA_TYPES[UA_TYPES_NODEID]);
        if(response->responseHeader.serviceResult == UA_STATUSCODE_GOOD)
            response->registeredNodeIdsSize = request->nodesToRegisterSize;
    }
}